

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cluster.h
# Opt level: O3

void brotli::CompareAndPushToQueue<brotli::Histogram<256>>
               (Histogram<256> *out,uint32_t *cluster_size,uint32_t idx1,uint32_t idx2,
               vector<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_> *pairs)

{
  pointer *ppHVar1;
  uint32_t *puVar2;
  uint uVar3;
  size_t sVar4;
  pointer pHVar5;
  HistogramPair *__args;
  iterator __position;
  uint uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  uint32_t uVar17;
  ulong uVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double __x;
  HistogramPair p;
  Histogram<256> combo;
  double local_480;
  HistogramPair local_470;
  double local_458;
  double local_450;
  double local_448;
  Histogram<256> local_440;
  
  if (idx1 == idx2) {
    return;
  }
  uVar6 = idx1;
  if (idx1 < idx2) {
    uVar6 = idx2;
  }
  uVar18 = (ulong)idx1;
  if (idx2 < idx1) {
    uVar18 = (ulong)idx2;
  }
  uVar17 = (uint32_t)uVar18;
  uVar15 = (ulong)cluster_size[uVar18];
  uVar3 = cluster_size[uVar6];
  uVar14 = (ulong)uVar3;
  local_470.idx1 = uVar17;
  local_470.idx2 = uVar6;
  if (uVar15 < 0x100) {
    dVar19 = (double)*(float *)(kLog2Table + uVar15 * 4);
  }
  else {
    dVar19 = log2((double)uVar15);
  }
  uVar16 = uVar15 + uVar14;
  local_448 = (double)uVar14;
  if (uVar3 < 0x100) {
    dVar21 = (double)*(float *)(kLog2Table + uVar14 * 4);
  }
  else {
    dVar21 = log2(local_448);
  }
  __x = (double)uVar16;
  if (uVar16 < 0x100) {
    dVar20 = (double)*(float *)(kLog2Table + uVar16 * 4);
  }
  else {
    local_458 = __x;
    local_450 = dVar21;
    dVar20 = log2(__x);
    __x = local_458;
    dVar21 = local_450;
  }
  local_470.cost_combo = out[uVar6].bit_cost_;
  dVar19 = ((((double)uVar15 * dVar19 + dVar21 * local_448) - __x * dVar20) * 0.5 -
           out[uVar18].bit_cost_) - local_470.cost_combo;
  if ((out[uVar18].total_count_ != 0) &&
     (sVar4 = out[uVar6].total_count_, local_470.cost_combo = out[uVar18].bit_cost_, sVar4 != 0)) {
    pHVar5 = (pairs->
             super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>).
             _M_impl.super__Vector_impl_data._M_start;
    if (pHVar5 == (pairs->
                  super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>)
                  ._M_impl.super__Vector_impl_data._M_finish) {
      local_480 = 1e+99;
    }
    else {
      local_480 = pHVar5->cost_diff;
      if (local_480 <= 0.0) {
        local_480 = 0.0;
      }
    }
    memcpy(&local_440,out + uVar18,0x410);
    local_440.total_count_ = local_440.total_count_ + sVar4;
    lVar13 = 0;
    do {
      puVar2 = out[uVar6].data_ + lVar13;
      uVar7 = puVar2[1];
      uVar8 = puVar2[2];
      uVar9 = puVar2[3];
      uVar10 = local_440.data_[lVar13 + 1];
      uVar11 = local_440.data_[lVar13 + 2];
      uVar12 = local_440.data_[lVar13 + 3];
      local_440.data_[lVar13] = local_440.data_[lVar13] + *puVar2;
      local_440.data_[lVar13 + 1] = uVar10 + uVar7;
      local_440.data_[lVar13 + 2] = uVar11 + uVar8;
      local_440.data_[lVar13 + 3] = uVar12 + uVar9;
      lVar13 = lVar13 + 4;
    } while (lVar13 != 0x100);
    local_470.cost_combo = PopulationCost<256>(&local_440);
    if (local_480 - dVar19 <= local_470.cost_combo) {
      return;
    }
  }
  local_470.cost_diff = local_470.cost_combo + dVar19;
  __args = (pairs->super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>
           )._M_impl.super__Vector_impl_data._M_start;
  __position._M_current =
       (pairs->super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (__args == __position._M_current) {
LAB_0017145c:
    if (__position._M_current ==
        (pairs->super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<brotli::HistogramPair,std::allocator<brotli::HistogramPair>>::
      _M_realloc_insert<brotli::HistogramPair_const&>
                ((vector<brotli::HistogramPair,std::allocator<brotli::HistogramPair>> *)pairs,
                 __position,&local_470);
    }
    else {
      (__position._M_current)->cost_diff = local_470.cost_diff;
      (__position._M_current)->idx1 = local_470.idx1;
      (__position._M_current)->idx2 = local_470.idx2;
      (__position._M_current)->cost_combo = local_470.cost_combo;
      ppHVar1 = &(pairs->
                 super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppHVar1 = *ppHVar1 + 1;
    }
  }
  else {
    dVar19 = __args->cost_diff;
    if ((dVar19 != local_470.cost_diff) || (NAN(dVar19) || NAN(local_470.cost_diff))) {
      if (dVar19 <= local_470.cost_diff) goto LAB_0017145c;
    }
    else if (__args->idx2 - __args->idx1 <= uVar6 - uVar17) goto LAB_0017145c;
    if (__position._M_current ==
        (pairs->super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<brotli::HistogramPair,std::allocator<brotli::HistogramPair>>::
      _M_realloc_insert<brotli::HistogramPair_const&>
                ((vector<brotli::HistogramPair,std::allocator<brotli::HistogramPair>> *)pairs,
                 __position,__args);
    }
    else {
      (__position._M_current)->cost_diff = __args->cost_diff;
      uVar17 = __args->idx2;
      dVar19 = __args->cost_combo;
      (__position._M_current)->idx1 = __args->idx1;
      (__position._M_current)->idx2 = uVar17;
      (__position._M_current)->cost_combo = dVar19;
      ppHVar1 = &(pairs->
                 super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppHVar1 = *ppHVar1 + 1;
    }
    pHVar5 = (pairs->
             super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>).
             _M_impl.super__Vector_impl_data._M_start;
    pHVar5->cost_diff = local_470.cost_diff;
    pHVar5->idx1 = local_470.idx1;
    pHVar5->idx2 = local_470.idx2;
    pHVar5->cost_combo = local_470.cost_combo;
  }
  return;
}

Assistant:

void CompareAndPushToQueue(const HistogramType* out,
                           const uint32_t* cluster_size,
                           uint32_t idx1, uint32_t idx2,
                           std::vector<HistogramPair>* pairs) {
  if (idx1 == idx2) {
    return;
  }
  if (idx2 < idx1) {
    uint32_t t = idx2;
    idx2 = idx1;
    idx1 = t;
  }
  bool store_pair = false;
  HistogramPair p;
  p.idx1 = idx1;
  p.idx2 = idx2;
  p.cost_diff = 0.5 * ClusterCostDiff(cluster_size[idx1], cluster_size[idx2]);
  p.cost_diff -= out[idx1].bit_cost_;
  p.cost_diff -= out[idx2].bit_cost_;

  if (out[idx1].total_count_ == 0) {
    p.cost_combo = out[idx2].bit_cost_;
    store_pair = true;
  } else if (out[idx2].total_count_ == 0) {
    p.cost_combo = out[idx1].bit_cost_;
    store_pair = true;
  } else {
    double threshold = pairs->empty() ? 1e99 :
        std::max(0.0, (*pairs)[0].cost_diff);
    HistogramType combo = out[idx1];
    combo.AddHistogram(out[idx2]);
    double cost_combo = PopulationCost(combo);
    if (cost_combo < threshold - p.cost_diff) {
      p.cost_combo = cost_combo;
      store_pair = true;
    }
  }
  if (store_pair) {
    p.cost_diff += p.cost_combo;
    if (!pairs->empty() && (pairs->front() < p)) {
      // Replace the top of the queue if needed.
      pairs->push_back(pairs->front());
      pairs->front() = p;
    } else {
      pairs->push_back(p);
    }
  }
}